

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui_sdl.c
# Opt level: O2

int ugui_sdl_get_event(ugui_sdl_t *sdl_ctx)

{
  int iVar1;
  int iVar2;
  int local_58 [2];
  SDL_Event event;
  
  iVar2 = 1;
  do {
    while( true ) {
      iVar1 = SDL_PollEvent(local_58);
      if (iVar1 == 0) {
        return 0;
      }
      if (local_58[0] != 0x300) break;
      switch(event.motion.which) {
      case 0x4000004f:
        return 4;
      case 0x40000050:
        return 3;
      case 0x40000051:
        iVar2 = 2;
      case 0x40000052:
        goto switchD_00104e20_caseD_40000052;
      }
      if ((event.motion.which == 0x1b) || (event.motion.which == 0x71)) goto LAB_00104e0d;
    }
  } while (local_58[0] != 0x100);
LAB_00104e0d:
  iVar2 = 7;
switchD_00104e20_caseD_40000052:
  return iVar2;
}

Assistant:

int ugui_sdl_get_event(ugui_sdl_t* sdl_ctx) {
	//Handle SDL events
	SDL_Event event;
	while (SDL_PollEvent(&event)) {
		if (event.type == SDL_QUIT) {
			return UGUI_EVT_EXIT;
		}
		if (event.type == SDL_KEYDOWN) {
			switch (event.key.keysym.sym) {
			case SDLK_UP:
				return UGUI_EVT_UP;
			case SDLK_DOWN:
				return UGUI_EVT_DOWN;
			case SDLK_LEFT:
				return UGUI_EVT_LEFT;
			case SDLK_RIGHT:
				return UGUI_EVT_RIGHT;
			case SDLK_ESCAPE:
			case SDLK_q:
				return UGUI_EVT_EXIT;
			}
		}
	}
	return UGUI_EVT_NONE;
}